

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_0::TypePrinter::TypePrinter
          (TypePrinter *this,ostream *os,HeapTypeNameGenerator *generator)

{
  HeapTypeNameGenerator *generator_local;
  ostream *os_local;
  TypePrinter *this_local;
  
  this->os = os;
  std::optional<wasm::DefaultTypeNameGenerator>::optional(&this->defaultGenerator);
  std::function<wasm::TypeNames_(wasm::HeapType)>::function(&this->generator,generator);
  return;
}

Assistant:

TypePrinter(std::ostream& os, HeapTypeNameGenerator generator)
    : os(os), defaultGenerator(), generator(generator) {}